

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O3

double __thiscall icu_63::CalendarAstronomer::getGreenwichSidereal(CalendarAstronomer *this)

{
  UBool UVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  UVar1 = uprv_isNaN_63(this->siderealTime);
  if (UVar1 == '\0') {
    dVar4 = this->siderealTime;
  }
  else {
    dVar2 = this->fTime / 3600000.0;
    dVar3 = uprv_floor_63(dVar2 / 24.0);
    dVar4 = getSiderealOffset(this);
    dVar4 = (dVar3 * -24.0 + dVar2) * 1.002737909 + dVar4;
    dVar2 = uprv_floor_63(dVar4 / 24.0);
    dVar4 = dVar2 * -24.0 + dVar4;
    this->siderealTime = dVar4;
  }
  return dVar4;
}

Assistant:

double CalendarAstronomer::getGreenwichSidereal() {
    if (isINVALID(siderealTime)) {
        // See page 86 of "Practial Astronomy with your Calculator",
        // by Peter Duffet-Smith, for details on the algorithm.

        double UT = normalize(fTime/(double)HOUR_MS, 24.);

        siderealTime = normalize(getSiderealOffset() + UT*1.002737909, 24.);
    }
    return siderealTime;
}